

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UgridReader.hpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
Parfait::UgridReader::readPyramids
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *filename,int begin,
          int end,bool swapBytes)

{
  undefined1 uVar1;
  undefined1 uVar2;
  pointer pcVar3;
  pointer piVar4;
  int *piVar5;
  int *piVar6;
  undefined8 uVar7;
  int iVar8;
  string *__rhs;
  FILE *__stream;
  long lVar9;
  domain_error *this;
  int *piVar10;
  vector<int,_std::allocator<int>_> *__range1;
  size_type __n;
  allocator_type local_a5;
  int local_a4;
  int ntet;
  int nquad;
  int ntri;
  int nnodes;
  ulong local_90;
  string *local_88;
  int nhex;
  int nprism;
  int npyr;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar3 = (filename->_M_dataplus)._M_p;
  local_88 = filename;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + filename->_M_string_length);
  readHeader(&local_70,&nnodes,&ntri,&nquad,&ntet,&npyr,&nprism,&nhex,swapBytes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_90 = (ulong)(uint)(end - begin);
  __n = (size_type)((end - begin) * 5);
  local_50._M_dataplus._M_p._0_4_ = 0;
  local_a4 = end;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,__n,(value_type_conflict2 *)&local_50,&local_a5);
  __rhs = local_88;
  __stream = fopen((local_88->_M_dataplus)._M_p,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,((long)(begin * 5) + (long)ntri * 4 + (long)nquad * 5 + (long)ntet * 4) * 4 +
                   (long)nnodes * 0x18 + 0x1c,0);
    fread((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start,4,__n,__stream);
    fclose(__stream);
    if (swapBytes && local_a4 != begin) {
      lVar9 = 0;
      do {
        piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar8 = piVar4[lVar9];
        uVar1 = *(undefined1 *)((long)piVar4 + lVar9 * 4 + 1);
        uVar2 = *(undefined1 *)((long)piVar4 + lVar9 * 4 + 2);
        *(undefined1 *)(piVar4 + lVar9) = *(undefined1 *)((long)piVar4 + lVar9 * 4 + 3);
        *(undefined1 *)((long)piVar4 + lVar9 * 4 + 1) = uVar2;
        *(undefined1 *)((long)piVar4 + lVar9 * 4 + 2) = uVar1;
        *(char *)((long)piVar4 + lVar9 * 4 + 3) = (char)iVar8;
        lVar9 = lVar9 + 1;
      } while (__n + (__n == 0) != lVar9);
    }
    piVar6 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    piVar5 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (piVar10 = piVar5; piVar10 != piVar6; piVar10 = piVar10 + 1) {
      *piVar10 = *piVar10 + -1;
    }
    if (0 < (int)local_90) {
      lVar9 = 0;
      do {
        uVar7 = *(undefined8 *)((long)piVar5 + lVar9 + 4);
        *(undefined8 *)((long)piVar5 + lVar9 + 4) = *(undefined8 *)((long)piVar5 + lVar9 + 0xc);
        *(undefined8 *)((long)piVar5 + lVar9 + 0xc) = uVar7;
        lVar9 = lVar9 + 0x14;
      } while ((local_90 & 0xffffffff) * 0x14 != lVar9);
    }
    return __return_storage_ptr__;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Could not open .ugrid file: ",__rhs);
  std::domain_error::domain_error(this,(string *)&local_50);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline std::vector<int> Parfait::UgridReader::readPyramids(std::string filename,int begin,int end,bool swapBytes) {
    int nnodes,ntri,nquad,ntet,npyr,nprism,nhex;
    // get header info and allocate space for triangles
    readHeader(filename,nnodes,ntri,nquad,ntet,npyr,nprism,nhex,swapBytes);
    int nrequested = end - begin;
    std::vector<int> pyrs(5*nrequested,0);

    FILE *f = fopen(filename.c_str(),"rb");
    if(f == NULL){
        throw std::domain_error("Could not open .ugrid file: "+filename);
    }
    unsigned long int byteOffset = 7*sizeof(int) + 3*nnodes*sizeof(double);
    byteOffset += 3*ntri*sizeof(int);
    byteOffset += 4*nquad*sizeof(int);
    byteOffset += (ntri+nquad)*sizeof(int);
    byteOffset += 4*ntet*sizeof(int);
    byteOffset += 5*begin*sizeof(int);
    fseek(f,byteOffset,SEEK_SET);
    fread(&pyrs[0],sizeof(int),5*nrequested,f);
    fclose(f);
    if(swapBytes) {
        for (size_t i = 0; i < 5 * nrequested; i++) {
            bswap_32(&pyrs[i]);
        }
    }

    for(int& vertex : pyrs)
        vertex--;

    for(int i = 0; i < nrequested; i++)
        Parfait::AflrToCGNS::convertPyramid(&pyrs[5*i]);

    return pyrs;
}